

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int aom_noise_strength_solver_fit_piecewise
              (aom_noise_strength_solver_t *solver,int max_output_points,
              aom_noise_strength_lut_t *lut)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  dVar1 = solver->max_intensity;
  iVar3 = aom_noise_strength_lut_init(lut,solver->num_bins);
  if (iVar3 == 0) {
    aom_noise_strength_solver_fit_piecewise_cold_1();
    iVar3 = 0;
  }
  else {
    iVar3 = solver->num_bins;
    lVar11 = (long)iVar3;
    if (0 < lVar11) {
      pdVar6 = (solver->eqns).x;
      pdVar5 = *lut->points + 1;
      lVar8 = 0;
      do {
        (*(double (*) [2])(pdVar5 + -1))[0] =
             ((double)(int)lVar8 / (double)(iVar3 + -1)) *
             (solver->max_intensity - solver->min_intensity) + solver->min_intensity;
        *pdVar5 = pdVar6[lVar8];
        lVar8 = lVar8 + 1;
        pdVar5 = pdVar5 + 2;
      } while (lVar11 != lVar8);
    }
    if (-1 < max_output_points) {
      iVar3 = max_output_points;
    }
    pdVar6 = (double *)aom_malloc(lVar11 << 3);
    if (pdVar6 == (double *)0x0) {
      iVar3 = 0;
      if (lut != (aom_noise_strength_lut_t *)0x0) {
        aom_free(lut->points);
        lut->points = (double (*) [2])0x0;
        *(undefined8 *)&lut->num_points = 0;
        iVar3 = 0;
      }
    }
    else {
      memset(pdVar6,0,(long)solver->num_bins << 3);
      update_piecewise_linear_residual(solver,lut,pdVar6,0,solver->num_bins);
      uVar4 = lut->num_points;
      if (2 < (int)uVar4) {
        do {
          uVar10 = 1;
          if (2 < uVar4) {
            uVar7 = 3;
            if (3 < (int)uVar4) {
              uVar7 = uVar4;
            }
            uVar10 = 1;
            uVar9 = 1;
            do {
              uVar2 = (uint)uVar9;
              if (pdVar6[(int)uVar10] < pdVar6[uVar9] || pdVar6[(int)uVar10] == pdVar6[uVar9]) {
                uVar2 = uVar10;
              }
              uVar10 = uVar2;
              uVar9 = uVar9 + 1;
            } while (uVar7 - 1 != uVar9);
          }
          if (((int)uVar4 <= iVar3) &&
             ((dVar1 * 0.00625) / 255.0 <
              pdVar6[(int)uVar10] /
              (lut->points[(int)(uVar10 + 1)][0] - lut->points[(int)(uVar10 - 1)][0]))) break;
          memmove(lut->points + (int)uVar10,lut->points + (long)(int)uVar10 + 1,
                  (long)(int)(uVar4 + ~uVar10) << 4);
          lut->num_points = lut->num_points + -1;
          update_piecewise_linear_residual(solver,lut,pdVar6,uVar10 - 1,uVar10 + 1);
          uVar4 = lut->num_points;
        } while (2 < (int)uVar4);
      }
      aom_free(pdVar6);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int aom_noise_strength_solver_fit_piecewise(
    const aom_noise_strength_solver_t *solver, int max_output_points,
    aom_noise_strength_lut_t *lut) {
  // The tolerance is normalized to be give consistent results between
  // different bit-depths.
  const double kTolerance = solver->max_intensity * 0.00625 / 255.0;
  if (!aom_noise_strength_lut_init(lut, solver->num_bins)) {
    fprintf(stderr, "Failed to init lut\n");
    return 0;
  }
  for (int i = 0; i < solver->num_bins; ++i) {
    lut->points[i][0] = aom_noise_strength_solver_get_center(solver, i);
    lut->points[i][1] = solver->eqns.x[i];
  }
  if (max_output_points < 0) {
    max_output_points = solver->num_bins;
  }

  double *residual = (double *)aom_malloc(solver->num_bins * sizeof(*residual));
  if (!residual) {
    aom_noise_strength_lut_free(lut);
    return 0;
  }
  memset(residual, 0, sizeof(*residual) * solver->num_bins);

  update_piecewise_linear_residual(solver, lut, residual, 0, solver->num_bins);

  // Greedily remove points if there are too many or if it doesn't hurt local
  // approximation (never remove the end points)
  while (lut->num_points > 2) {
    int min_index = 1;
    for (int j = 1; j < lut->num_points - 1; ++j) {
      if (residual[j] < residual[min_index]) {
        min_index = j;
      }
    }
    const double dx =
        lut->points[min_index + 1][0] - lut->points[min_index - 1][0];
    const double avg_residual = residual[min_index] / dx;
    if (lut->num_points <= max_output_points && avg_residual > kTolerance) {
      break;
    }

    const int num_remaining = lut->num_points - min_index - 1;
    memmove(lut->points + min_index, lut->points + min_index + 1,
            sizeof(lut->points[0]) * num_remaining);
    lut->num_points--;

    update_piecewise_linear_residual(solver, lut, residual, min_index - 1,
                                     min_index + 1);
  }
  aom_free(residual);
  return 1;
}